

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_geom::load_v9(xr_level_geom *this,xr_reader *r)

{
  uint32_t fvf;
  uint *puVar1;
  pointer pxVar2;
  uint32_t *puVar3;
  xr_ibuf *pxVar4;
  uint __line;
  xr_level_geom *pxVar5;
  xr_reader *pxVar6;
  d3d_vertex_element *ve;
  d3d_vertex_element *pdVar7;
  size_t n_ve;
  xr_ibuf *this_00;
  pointer pxVar8;
  xr_reader *s;
  xr_level_geom *local_40;
  xr_reader *local_38;
  
  pxVar6 = xr_reader::open_chunk(r,0xc);
  s = pxVar6;
  local_40 = this;
  local_38 = r;
  if (pxVar6 == (xr_reader *)0x0) {
    pxVar6 = xr_reader::open_chunk(r,4);
    if (pxVar6 == (xr_reader *)0x0) {
      __line = 0x22;
      goto LAB_0015b714;
    }
    puVar1 = (pxVar6->field_2).m_p_u32;
    (pxVar6->field_2).m_p = (uint8_t *)(puVar1 + 1);
    s = pxVar6;
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)*puVar1);
    pxVar2 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pxVar8 = (this->m_vbufs).
                  super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                  super__Vector_impl_data._M_start; pxVar8 != pxVar2; pxVar8 = pxVar8 + 1) {
      puVar3 = (pxVar6->field_2).m_p_u32;
      (pxVar6->field_2).m_p = (uint8_t *)(puVar3 + 1);
      fvf = *puVar3;
      (pxVar6->field_2).m_p = (uint8_t *)(puVar3 + 2);
      xr_vbuf::load_d3d7(pxVar8,pxVar6,(ulong)puVar3[1],fvf);
    }
  }
  else {
    puVar1 = (pxVar6->field_2).m_p_u32;
    (pxVar6->field_2).m_p = (uint8_t *)(puVar1 + 1);
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)*puVar1);
    pxVar2 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pxVar8 = (this->m_vbufs).
                  super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                  super__Vector_impl_data._M_start; pxVar8 != pxVar2; pxVar8 = pxVar8 + 1) {
      ve = xr_reader::skip<xray_re::d3d_vertex_element>(pxVar6,1);
      n_ve = 0;
      do {
        pdVar7 = xr_reader::skip<xray_re::d3d_vertex_element>(pxVar6,1);
        n_ve = n_ve + 1;
      } while (pdVar7->type != '\x11');
      puVar1 = (pxVar6->field_2).m_p_u32;
      (pxVar6->field_2).m_p = (uint8_t *)(puVar1 + 1);
      xr_vbuf::load_d3d9(pxVar8,pxVar6,(ulong)*puVar1,ve,n_ve);
    }
  }
  pxVar6 = local_38;
  xr_reader::close_chunk(local_38,&s);
  s = xr_reader::open_chunk(pxVar6,0xb);
  pxVar5 = local_40;
  if (s != (xr_reader *)0x0) {
    puVar1 = (s->field_2).m_p_u32;
    (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
    std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::resize
              (&local_40->m_ibufs,(ulong)*puVar1);
    pxVar4 = (pxVar5->m_ibufs).
             super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (pxVar5->m_ibufs).
                   super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pxVar4; this_00 = this_00 + 1) {
      puVar1 = (s->field_2).m_p_u32;
      (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
      xr_ibuf::load(this_00,s,(ulong)*puVar1);
    }
    xr_reader::close_chunk(pxVar6,&s);
    return;
  }
  __line = 0x2d;
LAB_0015b714:
  s = (xr_reader *)0x0;
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                ,__line,"void xray_re::xr_level_geom::load_v9(xr_reader &)");
}

Assistant:

void xr_level_geom::load_v9(xr_reader& r)
{
	xr_reader* s = r.open_chunk(FSL9_VB);
	if (s) {
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			const d3d_vertex_element *ve = s->skip<d3d_vertex_element>();
			size_t n_ve = 1;
			for (; s->skip<d3d_vertex_element>()->type != D3D_VE_TYPE_UNUSED; ++n_ve) {}
			it->load_d3d9(*s, s->r_u32(), ve, n_ve);
		}
		r.close_chunk(s);
	} else {
		s = r.open_chunk(FSL9_VB_OLD);
		xr_assert(s);
		m_vbufs.resize(s->r_u32());
		for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
			uint32_t fvf = s->r_u32();
			size_t n = s->r_u32();
			it->load_d3d7(*s, n, fvf);
		}
		r.close_chunk(s);
	}

	s = r.open_chunk(FSL9_IB);
	xr_assert(s);
	m_ibufs.resize(s->r_u32());
	for (xr_ibuf_vec_it it = m_ibufs.begin(), end = m_ibufs.end(); it != end; ++it)
		it->load(*s, s->r_u32());
	r.close_chunk(s);
}